

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::encodeString(JsonGenerator *this,string *s)

{
  State SVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  
  SVar1 = this->top;
  if (SVar1 == stKey) {
    this->top = stMapN;
  }
  else {
    if (SVar1 == stMapN) {
      StreamWriter::write(&this->out_,0x2c,in_RDX,in_RCX);
    }
    else if (SVar1 != stMap0) {
      sep(this);
      goto LAB_0016a2a9;
    }
    this->top = stKey;
  }
LAB_0016a2a9:
  doEncodeString(this,s);
  if (this->top == stKey) {
    StreamWriter::write(&this->out_,0x3a,__buf,in_RCX);
    return;
  }
  return;
}

Assistant:

void encodeString(const std::string& s) {
        if (top == stMap0) {
            top = stKey;
        } else if (top == stMapN) {
            out_.write(',');
            top = stKey;
        } else if (top == stKey) {
            top = stMapN;
        } else {
            sep();
        }
        doEncodeString(s);
        if (top == stKey) {
            out_.write(':');
        }
    }